

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char s [19];
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char cStack_38;
  char cStack_37;
  char cStack_36;
  
  local_48 = 's';
  cStack_47 = 'h';
  cStack_46 = 'r';
  cStack_45 = 'e';
  cStack_44 = 'i';
  cStack_43 = 'c';
  cStack_42 = 'n';
  cStack_41 = 'y';
  cStack_40 = 'j';
  cStack_3f = 'q';
  cStack_3e = 'p';
  cStack_3d = 'v';
  cStack_3c = 'o';
  cStack_3b = 'z';
  cStack_3a = 'x';
  cStack_39 = 'm';
  cStack_38 = 'b';
  cStack_37 = 't';
  cStack_36 = '\0';
  qsort(&local_48,0x12,1,compare);
  auVar5[0] = -(cStack_45 == 'h');
  auVar5[1] = -(cStack_44 == 'i');
  auVar5[2] = -(cStack_43 == 'j');
  auVar5[3] = -(cStack_42 == 'm');
  auVar5[4] = -(cStack_41 == 'n');
  auVar5[5] = -(cStack_40 == 'o');
  auVar5[6] = -(cStack_3f == 'p');
  auVar5[7] = -(cStack_3e == 'q');
  auVar5[8] = -(cStack_3d == 'r');
  auVar5[9] = -(cStack_3c == 's');
  auVar5[10] = -(cStack_3b == 't');
  auVar5[0xb] = -(cStack_3a == 'v');
  auVar5[0xc] = -(cStack_39 == 'x');
  auVar5[0xd] = -(cStack_38 == 'y');
  auVar5[0xe] = -(cStack_37 == 'z');
  auVar5[0xf] = -(cStack_36 == '\0');
  auVar1[0] = -(local_48 == 'b');
  auVar1[1] = -(cStack_47 == 'c');
  auVar1[2] = -(cStack_46 == 'e');
  auVar1[3] = -(cStack_45 == 'h');
  auVar1[4] = -(cStack_44 == 'i');
  auVar1[5] = -(cStack_43 == 'j');
  auVar1[6] = -(cStack_42 == 'm');
  auVar1[7] = -(cStack_41 == 'n');
  auVar1[8] = -(cStack_40 == 'o');
  auVar1[9] = -(cStack_3f == 'p');
  auVar1[10] = -(cStack_3e == 'q');
  auVar1[0xb] = -(cStack_3d == 'r');
  auVar1[0xc] = -(cStack_3c == 's');
  auVar1[0xd] = -(cStack_3b == 't');
  auVar1[0xe] = -(cStack_3a == 'v');
  auVar1[0xf] = -(cStack_39 == 'x');
  auVar1 = auVar1 & auVar5;
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) != 0xffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xaa,"strcmp( s, sorted1 ) == 0");
  }
  local_48 = 's';
  cStack_47 = 'h';
  cStack_46 = 'r';
  cStack_45 = 'e';
  cStack_44 = 'i';
  cStack_43 = 'c';
  cStack_42 = 'n';
  cStack_41 = 'y';
  cStack_40 = 'j';
  cStack_3f = 'q';
  cStack_3e = 'p';
  cStack_3d = 'v';
  cStack_3c = 'o';
  cStack_3b = 'z';
  cStack_3a = 'x';
  cStack_39 = 'm';
  cStack_38 = 'b';
  cStack_37 = 't';
  cStack_36 = '\0';
  qsort(&local_48,9,2,compare);
  auVar6[0] = -(cStack_45 == 'c');
  auVar6[1] = -(cStack_44 == 'j');
  auVar6[2] = -(cStack_43 == 'q');
  auVar6[3] = -(cStack_42 == 'n');
  auVar6[4] = -(cStack_41 == 'y');
  auVar6[5] = -(cStack_40 == 'o');
  auVar6[6] = -(cStack_3f == 'z');
  auVar6[7] = -(cStack_3e == 'p');
  auVar6[8] = -(cStack_3d == 'v');
  auVar6[9] = -(cStack_3c == 'r');
  auVar6[10] = -(cStack_3b == 'e');
  auVar6[0xb] = -(cStack_3a == 's');
  auVar6[0xc] = -(cStack_39 == 'h');
  auVar6[0xd] = -(cStack_38 == 'x');
  auVar6[0xe] = -(cStack_37 == 'm');
  auVar6[0xf] = -(cStack_36 == '\0');
  auVar2[0] = -(local_48 == 'b');
  auVar2[1] = -(cStack_47 == 't');
  auVar2[2] = -(cStack_46 == 'i');
  auVar2[3] = -(cStack_45 == 'c');
  auVar2[4] = -(cStack_44 == 'j');
  auVar2[5] = -(cStack_43 == 'q');
  auVar2[6] = -(cStack_42 == 'n');
  auVar2[7] = -(cStack_41 == 'y');
  auVar2[8] = -(cStack_40 == 'o');
  auVar2[9] = -(cStack_3f == 'z');
  auVar2[10] = -(cStack_3e == 'p');
  auVar2[0xb] = -(cStack_3d == 'v');
  auVar2[0xc] = -(cStack_3c == 'r');
  auVar2[0xd] = -(cStack_3b == 'e');
  auVar2[0xe] = -(cStack_3a == 's');
  auVar2[0xf] = -(cStack_39 == 'h');
  auVar2 = auVar2 & auVar6;
  if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) != 0xffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xad,"strcmp( s, sorted2 ) == 0");
  }
  local_48 = 's';
  cStack_47 = 'h';
  cStack_46 = 'r';
  cStack_45 = 'e';
  cStack_44 = 'i';
  cStack_43 = 'c';
  cStack_42 = 'n';
  cStack_41 = 'y';
  cStack_40 = 'j';
  cStack_3f = 'q';
  cStack_3e = 'p';
  cStack_3d = 'v';
  cStack_3c = 'o';
  cStack_3b = 'z';
  cStack_3a = 'x';
  cStack_39 = 'm';
  cStack_38 = 'b';
  cStack_37 = 't';
  cStack_36 = '\0';
  qsort(&local_48,1,1,compare);
  auVar7[0] = -(cStack_45 == 'e');
  auVar7[1] = -(cStack_44 == 'i');
  auVar7[2] = -(cStack_43 == 'c');
  auVar7[3] = -(cStack_42 == 'n');
  auVar7[4] = -(cStack_41 == 'y');
  auVar7[5] = -(cStack_40 == 'j');
  auVar7[6] = -(cStack_3f == 'q');
  auVar7[7] = -(cStack_3e == 'p');
  auVar7[8] = -(cStack_3d == 'v');
  auVar7[9] = -(cStack_3c == 'o');
  auVar7[10] = -(cStack_3b == 'z');
  auVar7[0xb] = -(cStack_3a == 'x');
  auVar7[0xc] = -(cStack_39 == 'm');
  auVar7[0xd] = -(cStack_38 == 'b');
  auVar7[0xe] = -(cStack_37 == 't');
  auVar7[0xf] = -(cStack_36 == '\0');
  auVar3[0] = -(local_48 == 's');
  auVar3[1] = -(cStack_47 == 'h');
  auVar3[2] = -(cStack_46 == 'r');
  auVar3[3] = -(cStack_45 == 'e');
  auVar3[4] = -(cStack_44 == 'i');
  auVar3[5] = -(cStack_43 == 'c');
  auVar3[6] = -(cStack_42 == 'n');
  auVar3[7] = -(cStack_41 == 'y');
  auVar3[8] = -(cStack_40 == 'j');
  auVar3[9] = -(cStack_3f == 'q');
  auVar3[10] = -(cStack_3e == 'p');
  auVar3[0xb] = -(cStack_3d == 'v');
  auVar3[0xc] = -(cStack_3c == 'o');
  auVar3[0xd] = -(cStack_3b == 'z');
  auVar3[0xe] = -(cStack_3a == 'x');
  auVar3[0xf] = -(cStack_39 == 'm');
  auVar3 = auVar3 & auVar7;
  if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) != 0xffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xb0,"strcmp( s, presort ) == 0");
  }
  qsort(&local_48,100,0,compare);
  auVar4[0] = -(local_48 == 's');
  auVar4[1] = -(cStack_47 == 'h');
  auVar4[2] = -(cStack_46 == 'r');
  auVar4[3] = -(cStack_45 == 'e');
  auVar4[4] = -(cStack_44 == 'i');
  auVar4[5] = -(cStack_43 == 'c');
  auVar4[6] = -(cStack_42 == 'n');
  auVar4[7] = -(cStack_41 == 'y');
  auVar4[8] = -(cStack_40 == 'j');
  auVar4[9] = -(cStack_3f == 'q');
  auVar4[10] = -(cStack_3e == 'p');
  auVar4[0xb] = -(cStack_3d == 'v');
  auVar4[0xc] = -(cStack_3c == 'o');
  auVar4[0xd] = -(cStack_3b == 'z');
  auVar4[0xe] = -(cStack_3a == 'x');
  auVar4[0xf] = -(cStack_39 == 'm');
  auVar8[0] = -(cStack_45 == 'e');
  auVar8[1] = -(cStack_44 == 'i');
  auVar8[2] = -(cStack_43 == 'c');
  auVar8[3] = -(cStack_42 == 'n');
  auVar8[4] = -(cStack_41 == 'y');
  auVar8[5] = -(cStack_40 == 'j');
  auVar8[6] = -(cStack_3f == 'q');
  auVar8[7] = -(cStack_3e == 'p');
  auVar8[8] = -(cStack_3d == 'v');
  auVar8[9] = -(cStack_3c == 'o');
  auVar8[10] = -(cStack_3b == 'z');
  auVar8[0xb] = -(cStack_3a == 'x');
  auVar8[0xc] = -(cStack_39 == 'm');
  auVar8[0xd] = -(cStack_38 == 'b');
  auVar8[0xe] = -(cStack_37 == 't');
  auVar8[0xf] = -(cStack_36 == '\0');
  auVar4 = auVar4 & auVar8;
  if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xb7,"strcmp( s, presort ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char presort[] = { "shreicnyjqpvozxmbt" };
    char sorted1[] = { "bcehijmnopqrstvxyz" };
    char sorted2[] = { "bticjqnyozpvreshxm" };
    char s[19];
    strcpy( s, presort );
    qsort( s, 18, 1, compare );
    TESTCASE( strcmp( s, sorted1 ) == 0 );
    strcpy( s, presort );
    qsort( s, 9, 2, compare );
    TESTCASE( strcmp( s, sorted2 ) == 0 );
    strcpy( s, presort );
    qsort( s, 1, 1, compare );
    TESTCASE( strcmp( s, presort ) == 0 );
#if defined( REGTEST ) && ( defined( __BSD_VISIBLE ) || defined( __APPLE__ ) )
    puts( "qsort.c: Skipping test #4 for BSD as it goes into endless loop here." );
#elif defined( REGTEST ) && defined( __ANDROID__ )
    puts( "qsort.c: Skipping test #4 for Android as it crashes." );
#else
    qsort( s, 100, 0, compare );
    TESTCASE( strcmp( s, presort ) == 0 );
#endif
    return TEST_RESULTS;
}